

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SilentAggregateSystem.cpp
# Opt level: O1

KString * __thiscall
KDIS::DATA_TYPE::SilentAggregateSystem::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,SilentAggregateSystem *this)

{
  ostream *poVar1;
  KStringStream ss;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Silent Aggregate System:\n",0x19);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Number Of Aggregates:  ",0x17);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_190);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  AggregateType::GetAsString_abi_cxx11_(&local_1c0,&this->m_AggTyp);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString SilentAggregateSystem::GetAsString() const
{
    KStringStream ss;

    ss << "Silent Aggregate System:\n"
       << "Number Of Aggregates:  " << m_ui16NumAggregates << "\n"
       << m_AggTyp.GetAsString();

    return ss.str();
}